

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O3

void __thiscall
GlobalBailOutRecordDataTable::Finalize
          (GlobalBailOutRecordDataTable *this,Allocator *allocator,JitArenaAllocator *tempAlloc)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  GlobalBailOutRecordDataRow *__dest;
  uint uVar5;
  long lVar6;
  uint32 i;
  ulong uVar7;
  uint32 *puVar8;
  
  uVar5 = this->length;
  BVar3 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                       "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar2) goto LAB_003fee35;
    *puVar4 = 0;
  }
  __dest = (GlobalBailOutRecordDataRow *)
           NativeCodeData::Allocator::AllocZero(allocator,(ulong)uVar5 << 4);
  if (__dest == (GlobalBailOutRecordDataRow *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar2) {
LAB_003fee35:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  memcpy(__dest,this->globalBailOutRecordDataRows,(ulong)this->length << 4);
  Memory::DeleteArray<Memory::JitArenaAllocator,GlobalBailOutRecordDataRow>
            (tempAlloc,(ulong)this->length,this->globalBailOutRecordDataRows);
  this->globalBailOutRecordDataRows = __dest;
  uVar5 = this->length;
  this->size = uVar5;
  if (1 < uVar5) {
    puVar8 = &__dest->start;
    uVar7 = 1;
    lVar6 = 0x14;
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      if (*(uint *)((long)&__dest->offset + lVar6) < *puVar8) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                           ,0xbb6,"(currStart <= globalBailOutRecordDataRows[i].start)",
                           "Rows in the table must be in order by start ID");
        if (!bVar2) goto LAB_003fee35;
        *puVar4 = 0;
        __dest = this->globalBailOutRecordDataRows;
        uVar5 = this->length;
      }
      puVar8 = (uint32 *)((long)&__dest->offset + lVar6);
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x10;
    } while (uVar7 < uVar5);
  }
  return;
}

Assistant:

void GlobalBailOutRecordDataTable::Finalize(NativeCodeData::Allocator *allocator, JitArenaAllocator *tempAlloc)
{
    GlobalBailOutRecordDataRow *newRows = NativeCodeDataNewArrayZNoFixup(allocator, GlobalBailOutRecordDataRow, length);
    memcpy(newRows, globalBailOutRecordDataRows, sizeof(GlobalBailOutRecordDataRow) * length);
    JitAdeleteArray(tempAlloc, length, globalBailOutRecordDataRows);
    globalBailOutRecordDataRows = newRows;
    size = length;

#if DBG
    if (length > 0)
    {
        uint32 currStart = globalBailOutRecordDataRows[0].start;
        for (uint32 i = 1; i < length; i++)
        {
            AssertMsg(currStart <= globalBailOutRecordDataRows[i].start,
                      "Rows in the table must be in order by start ID");
            currStart = globalBailOutRecordDataRows[i].start;
        }
    }
#endif
}